

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GPUShader5PreciseQualifier::iterate(GPUShader5PreciseQualifier *this)

{
  GLfloat GVar1;
  bool bVar2;
  GLuint GVar3;
  WeightedSum local_78;
  GLfloat local_74;
  WeightedSum weighted_sum_backward [4];
  uint local_60;
  GLuint component_nr_1;
  GLfloat temp_value;
  WeightedSum weighted_sum_forward [4];
  uint local_40;
  GLfloat random_value;
  GLuint component_nr;
  GLfloat weights_sum;
  GLfloat vertex_data_weights [4];
  GLfloat vertex_data_positions [4];
  GLuint test_iter;
  GLboolean test_failed;
  GPUShader5PreciseQualifier *this_local;
  
  initTest(this);
  TestCaseBase::randomSeed(&this->super_TestCaseBase,1);
  bVar2 = false;
  vertex_data_positions[2] = 0.0;
  do {
    if (99 < (uint)vertex_data_positions[2]) {
LAB_015e3411:
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    random_value = 1.0;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,2000);
      vertex_data_weights[(ulong)local_40 + 2] = (float)(int)(GVar3 - 1000);
      if (local_40 == 3) {
        vertex_data_weights[1] = random_value;
      }
      else {
        GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,1000);
        weighted_sum_forward[3].floatv = (float)GVar3 / 1000.0;
        ((WeightedSum *)(&component_nr + local_40))->floatv = (float)weighted_sum_forward[3];
        random_value = random_value - weighted_sum_forward[3].floatv;
      }
    }
    drawAndGetFeedbackResult
              (this,vertex_data_weights + 2,(GLfloat *)&component_nr,(WeightedSum *)&component_nr_1)
    ;
    for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
      GVar1 = vertex_data_weights[(ulong)local_60 + 2];
      vertex_data_weights[(ulong)local_60 + 2] = vertex_data_weights[(ulong)(3 - local_60) + 2];
      vertex_data_weights[(ulong)(3 - local_60) + 2] = GVar1;
      GVar3 = (&component_nr)[local_60];
      (&component_nr)[local_60] = (&component_nr)[3 - local_60];
      (&component_nr)[3 - local_60] = GVar3;
    }
    drawAndGetFeedbackResult(this,vertex_data_weights + 2,(GLfloat *)&component_nr,&local_78);
    if (((((GLfloat)local_78.intv != local_74) || (local_78.intv != weighted_sum_backward[0].intv))
        || (local_78.intv != component_nr_1)) ||
       (((GLfloat)local_78.intv != temp_value || (local_78.intv != weighted_sum_forward[0].intv))))
    {
      bVar2 = true;
      goto LAB_015e3411;
    }
    vertex_data_positions[2] = (GLfloat)((int)vertex_data_positions[2] + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5PreciseQualifier::iterate(void)
{
	initTest();

	/* Set the seed for the random generator */
	randomSeed(1);

	glw::GLboolean test_failed = false;

	for (glw::GLuint test_iter = 0; test_iter < m_n_iterations; ++test_iter)
	{
		/* Create the data for positions and weights attributes */
		glw::GLfloat vertex_data_positions[m_n_components];
		glw::GLfloat vertex_data_weights[m_n_components];
		glw::GLfloat weights_sum = 1.0f;

		for (glw::GLuint component_nr = 0; component_nr < m_n_components; ++component_nr)
		{
			vertex_data_positions[component_nr] = static_cast<glw::GLfloat>(
				static_cast<glw::GLint>(randomFormula(2 * m_position_range)) - m_position_range);

			if (component_nr != (m_n_components - 1))
			{
				glw::GLfloat random_value = static_cast<glw::GLfloat>(randomFormula(m_position_range)) /
											static_cast<glw::GLfloat>(m_position_range);

				vertex_data_weights[component_nr] = random_value;
				weights_sum -= random_value;
			}
			else
			{
				vertex_data_weights[component_nr] = weights_sum;
			}
		}

		/* Compute forward weighted sum */
		WeightedSum weighted_sum_forward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_forward);

		/* Reverse the data for positions and weights attributes */
		glw::GLfloat temp_value = 0.0f;

		for (glw::GLuint component_nr = 0; component_nr < (m_n_components / 2); ++component_nr)
		{
			temp_value = vertex_data_positions[component_nr];

			vertex_data_positions[component_nr] = vertex_data_positions[m_n_components - 1 - component_nr];
			vertex_data_positions[m_n_components - 1 - component_nr] = temp_value;

			temp_value = vertex_data_weights[component_nr];

			vertex_data_weights[component_nr] = vertex_data_weights[m_n_components - 1 - component_nr];
			vertex_data_weights[m_n_components - 1 - component_nr] = temp_value;
		}

		/* Compute backward weighted sum */
		WeightedSum weighted_sum_backward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_backward);

		/* Check if results are bitwise accurate */
		if (weighted_sum_backward[0].intv != weighted_sum_backward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_backward[2].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[0].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[2].intv)
		{
			test_failed = true;
			break;
		}
	}

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}